

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (string *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestInfo *this;
  allocator<char> local_a1;
  TypeId local_a0;
  string local_98;
  CodeLocation local_78;
  string local_50;
  
  local_a0 = fixture_class_id;
  this = (TestInfo *)operator_new(0x110);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(test_suite_name->_M_dataplus)._M_p;
  paVar1 = &test_suite_name->field_2;
  if (paVar2 == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&test_suite_name->field_2 + 8);
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  local_98._M_string_length = test_suite_name->_M_string_length;
  (test_suite_name->_M_dataplus)._M_p = (pointer)paVar1;
  test_suite_name->_M_string_length = 0;
  (test_suite_name->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_a1);
  paVar2 = &local_78.file.field_2;
  local_78.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p == paVar1) {
    local_78.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_78.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_78.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_78.line = code_location->line;
  TestInfo::TestInfo(this,&local_98,&local_50,type_param,value_param,&local_78,local_a0,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,set_up_tc,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    std::string test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(std::move(test_suite_name), name, type_param, value_param,
                   std::move(code_location), fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}